

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyBodyBushingSpherical::ChLoadBodyBodyBushingSpherical
          (ChLoadBodyBodyBushingSpherical *this,shared_ptr<chrono::ChBody> *bodyA,
          shared_ptr<chrono::ChBody> *bodyB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping)

{
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&bodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&bodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadBodyBody::ChLoadBodyBody
            (&this->super_ChLoadBodyBody,(shared_ptr<chrono::ChBody> *)&local_50,
             (shared_ptr<chrono::ChBody> *)&local_40,abs_application);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  (this->super_ChLoadBodyBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyBody_0116cf40;
  (this->stiffness).m_data[0] = mstiffness->m_data[0];
  (this->stiffness).m_data[1] = mstiffness->m_data[1];
  (this->stiffness).m_data[2] = mstiffness->m_data[2];
  (this->damping).m_data[0] = mdamping->m_data[0];
  (this->damping).m_data[1] = mdamping->m_data[1];
  (this->damping).m_data[2] = mdamping->m_data[2];
  return;
}

Assistant:

ChLoadBodyBodyBushingSpherical::ChLoadBodyBodyBushingSpherical(std::shared_ptr<ChBody> bodyA,
                                                               std::shared_ptr<ChBody> bodyB,
                                                               const ChFrame<>& abs_application,
                                                               const ChVector<>& mstiffness,
                                                               const ChVector<>& mdamping)
    : ChLoadBodyBody(bodyA, bodyB, abs_application), stiffness(mstiffness), damping(mdamping) {}